

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_post_effects.cpp
# Opt level: O3

bool __thiscall ON_PostEffect::SetAllParameters(ON_PostEffect *this,ON_PostEffectParams *params)

{
  int iVar1;
  int iVar2;
  ON_XMLNode *pOVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  
  pOVar3 = CImpl::PepNode(this->_impl);
  if (pOVar3 != (ON_XMLNode *)0x0) {
    iVar1 = (*pOVar3->_vptr_ON_XMLNode[0x25])(pOVar3,L"state");
    if ((ON_XMLNode *)CONCAT44(extraout_var,iVar1) != (ON_XMLNode *)0x0) {
      iVar2 = (*params->_vptr_ON_PostEffectParams[4])(params);
      pOVar3 = ON_XMLParameters::Node((ON_XMLParameters *)CONCAT44(extraout_var_00,iVar2));
      ON_XMLNode::operator=((ON_XMLNode *)CONCAT44(extraout_var,iVar1),pOVar3);
      return true;
    }
  }
  return false;
}

Assistant:

bool ON_PostEffect::SetAllParameters(const ON_PostEffectParams& params)
{
  ON_XMLNode* pep_node = _impl->PepNode();
  if (nullptr == pep_node)
    return false;

  ON_XMLNode* pep_param_node = pep_node->GetNamedChild(ON_RDK_PEP_PARAMS);
  if (nullptr == pep_param_node)
      return false;

  *pep_param_node = params.AsXMLParameters().Node();

  return true;
}